

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armformatter.cpp
# Opt level: O1

Error asmjit::v1_14::arm::FormatterInternal::formatCondCode(String *sb,CondCode cc)

{
  uint uVar1;
  Error EVar2;
  
  uVar1 = 0x10;
  if (cc < 0x10) {
    uVar1 = (uint)cc;
  }
  EVar2 = String::_opString(sb,kAppend,"al" + (uVar1 * 3 & 0xff),0xffffffffffffffff);
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatCondCode(String& sb, CondCode cc) noexcept {
  static const char condCodeData[] =
    "al\0" "na\0"
    "eq\0" "ne\0"
    "hs\0" "lo\0" "mi\0" "pl\0" "vs\0" "vc\0"
    "hi\0" "ls\0" "ge\0" "lt\0" "gt\0" "le\0"
    "<Unknown>";
  return sb.append(condCodeData + Support::min<uint32_t>(uint32_t(cc), 16u) * 3);
}